

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,1,_1,false>,Eigen::internal::add_assign_op<float,float>>
               (Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>
               *src,add_assign_op<float,_float> *func)

{
  variable_if_dynamic<long,__1> func_00;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dstExpr;
  undefined1 local_80 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> *func_local;
  Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false> *src_local
  ;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  srcEvaluator.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_0,_1,_1>_>
  .m_outerStride.m_value = (long)func;
  evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>_>
  ::evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>_>
               *)local_38,src);
  resize_if_allowed<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,1,_1,false>,Eigen::internal::add_assign_op<float,float>>
            (dst,src,(add_assign_op<float,_float> *)
                     srcEvaluator.
                     super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false,_true>
                     .
                     super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_0,_1,_1>_>
                     .m_outerStride.m_value);
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_0,_1,_1>_>
            .m_outerStride;
  dstExpr = EigenBase<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
            const_cast_derived((EigenBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
              *)local_80,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (add_assign_op<float,_float> *)func_00.m_value,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_0,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
         *)local_80);
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::~evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr);
  evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>_>
  ::~evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>_>
                *)local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}